

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_b20dc::ParserImpl::ParseBlock(ParserImpl *this)

{
  TokenDetail *detail;
  TokenDetail *t;
  _func_int *p_Var1;
  iterator __position;
  String *pSVar2;
  char *pcVar3;
  undefined8 uVar4;
  TokenDetail op;
  TokenDetail op_00;
  TokenDetail op_01;
  TokenDetail op_02;
  TokenDetail op_03;
  TokenDetail op_04;
  undefined4 uVar5;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aVar6;
  int iVar7;
  int iVar8;
  _func_int **pp_Var9;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aVar10;
  TokenDetail *pTVar11;
  anon_union_8_2_010d16d7_for_TokenDetail_0 *paVar12;
  GCObject *pGVar13;
  ParseException *pPVar14;
  GCObject **this_00;
  Lexer *pLVar15;
  ParserImpl *in_RSI;
  bool bVar16;
  TokenDetail name;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> exp_list;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> exp1;
  PrefixExpType type;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> block;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> exp2;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_190;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_188;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aStack_180;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_178;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aStack_170;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_140;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_110;
  undefined1 local_108 [32];
  undefined1 local_e8 [56];
  _func_int **local_b0;
  _func_int **local_a8;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_a0;
  String *local_98;
  _func_int **local_90;
  _func_int **local_88;
  _func_int **local_80;
  _func_int **local_78;
  _func_int **local_70;
  _func_int **local_68;
  _func_int **local_60;
  _func_int **local_58;
  _func_int **local_50;
  ParserImpl *local_48;
  vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
  *local_40;
  undefined **local_38;
  
  local_48 = this;
  local_108._24_8_ = operator_new(0x28);
  *(undefined ***)local_108._24_8_ = &PTR__Block_00187dc8;
  ((SyntaxTree *)(local_108._24_8_ + 8))->_vptr_SyntaxTree = (_func_int **)0x0;
  ((SyntaxTree *)(local_108._24_8_ + 0x10))->_vptr_SyntaxTree = (_func_int **)0x0;
  ((SyntaxTree *)(local_108._24_8_ + 0x18))->_vptr_SyntaxTree = (_func_int **)0x0;
  ((SyntaxTree *)(local_108._24_8_ + 0x20))->_vptr_SyntaxTree = (_func_int **)0x0;
  local_38 = &PTR__ReturnStatement_00187e08;
  local_90 = (_func_int **)&PTR__VarList_001881c8;
  local_98 = (String *)&PTR__AssignmentStatement_00188188;
  local_50 = (_func_int **)&PTR__SyntaxTree_00187e48;
  local_60 = (_func_int **)&PTR__DoStatement_00187e88;
  local_a8 = (_func_int **)&PTR__NumericForStatement_00188008;
  local_a0.number_ = (double)&PTR__GenericForStatement_00188048;
  local_58 = (_func_int **)&PTR__FunctionName_001880c8;
  local_80 = (_func_int **)&PTR__FunctionStatement_00188088;
  local_70 = (_func_int **)&PTR__IfStatement_00187f48;
  local_88 = (_func_int **)&PTR__LocalNameListStatement_00188148;
  local_b0 = (_func_int **)&PTR__LocalFunctionStatement_00188108;
  local_68 = (_func_int **)&PTR__RepeatStatement_00187f08;
  local_78 = (_func_int **)&PTR__WhileStatement_00187ec8;
  local_40 = (vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
              *)(local_108._24_8_ + 8);
  detail = &in_RSI->look_ahead_;
  t = &in_RSI->current_;
  bVar16 = false;
LAB_0014f0ba:
  iVar7 = (in_RSI->look_ahead_).token_;
  if (iVar7 == 0x11e) {
    luna::Lexer::GetToken(in_RSI->lexer_,detail);
    iVar7 = (in_RSI->look_ahead_).token_;
    if (iVar7 == 0x11e) goto LAB_0014fdb9;
  }
  if ((iVar7 - 0x103U < 0x11) && ((0x10007U >> (iVar7 - 0x103U & 0x1f) & 1) != 0)) {
LAB_0014fdb9:
    local_48->lexer_ = (Lexer *)local_108._24_8_;
    return (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>)
           (SyntaxTree *)local_108._24_8_;
  }
  if (bVar16) {
    pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
    luna::ParseException::ParseException(pPVar14,"unexpect statement after return statement",detail)
    ;
    __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
  }
  bVar16 = iVar7 == 0x110;
  if (bVar16) {
    NextToken(in_RSI);
    if ((in_RSI->current_).token_ != 0x110) {
      __assert_fail("current_.token_ == Token_Return",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                    ,0xe0,
                    "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseReturnStatement()"
                   );
    }
    pp_Var9 = (_func_int **)operator_new(0x18);
    iVar7 = (in_RSI->current_).line_;
    *pp_Var9 = (_func_int *)local_38;
    pp_Var9[1] = (_func_int *)0x0;
    *(int *)(pp_Var9 + 2) = iVar7;
    *(undefined4 *)((long)pp_Var9 + 0x14) = 0;
    iVar7 = (in_RSI->look_ahead_).token_;
    if (iVar7 == 0x11e) {
      luna::Lexer::GetToken(in_RSI->lexer_,detail);
      iVar7 = (in_RSI->look_ahead_).token_;
      if (iVar7 != 0x11e) goto LAB_0014f17f;
    }
    else {
LAB_0014f17f:
      if ((0x10 < iVar7 - 0x103U) || ((0x10007U >> (iVar7 - 0x103U & 0x1f) & 1) == 0)) {
        if (iVar7 != 0x3b) {
          ParseExpList((ParserImpl *)&local_188);
          p_Var1 = pp_Var9[1];
          *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)(pp_Var9 + 1) = local_188;
          if (p_Var1 != (_func_int *)0x0) {
            (**(code **)(*(long *)p_Var1 + 8))();
          }
          iVar7 = (in_RSI->look_ahead_).token_;
          if (iVar7 == 0x11e) {
            luna::Lexer::GetToken(in_RSI->lexer_,detail);
            iVar7 = (in_RSI->look_ahead_).token_;
          }
          if (iVar7 != 0x3b) goto LAB_0014f1e8;
        }
        NextToken(in_RSI);
      }
    }
LAB_0014f1e8:
    aVar10 = (anon_union_8_2_010d16d7_for_TokenDetail_0)
             ((SyntaxTree *)(local_108._24_8_ + 0x20))->_vptr_SyntaxTree;
    ((SyntaxTree *)(local_108._24_8_ + 0x20))->_vptr_SyntaxTree = pp_Var9;
    goto LAB_0014fda5;
  }
  switch(iVar7) {
  case 0x101:
    aVar10.str_ = (String *)operator_new(0x30);
    pTVar11 = NextToken(in_RSI);
    ((aVar10.str_)->super_GCObject)._vptr_GCObject = local_50;
    pSVar2 = pTVar11->module_;
    pcVar3 = *(char **)&pTVar11->line_;
    uVar4 = *(undefined8 *)&pTVar11->token_;
    ((aVar10.str_)->super_GCObject).next_ = (GCObject *)pTVar11->field_0;
    *(String **)&((aVar10.str_)->super_GCObject).field_0x10 = pSVar2;
    ((aVar10.str_)->field_1).str_ = pcVar3;
    *(undefined8 *)((long)&(aVar10.str_)->field_1 + 8) = uVar4;
    *(undefined8 *)&(aVar10.str_)->length_ = 0;
    local_190.str_ = aVar10.str_;
    break;
  case 0x102:
    NextToken(in_RSI);
    if ((in_RSI->current_).token_ != 0x102) {
      __assert_fail("current_.token_ == Token_Do",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                    ,0x11c,
                    "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseDoStatement()"
                   );
    }
    ParseBlock((ParserImpl *)&local_188);
    pTVar11 = NextToken(in_RSI);
    if (pTVar11->token_ != 0x105) {
      pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
      luna::ParseException::ParseException(pPVar14,"expect \'end\' for do-statement",t);
      __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
    }
    local_190.str_ = (String *)operator_new(0x10);
    ((local_190.str_)->super_GCObject)._vptr_GCObject = local_60;
    ((local_190.str_)->super_GCObject).next_ = (GCObject *)local_188;
    break;
  case 0x103:
  case 0x104:
  case 0x105:
  case 0x106:
  case 0x10a:
  case 0x10c:
  case 0x10d:
  case 0x10e:
  case 0x110:
  case 0x111:
  case 0x112:
  case 0x113:
switchD_0014f216_caseD_103:
    iVar7 = (in_RSI->look_ahead_).line_;
    ParsePrefixExp((ParserImpl *)&local_188,(PrefixExpType *)in_RSI);
    if (local_138._0_4_ != 2) {
      if (local_138._0_4_ != 1) {
        pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException(pPVar14,"incomplete statement",t);
        __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
      }
      local_e8._40_8_ = operator_new(0x20);
      (((String *)local_e8._40_8_)->super_GCObject)._vptr_GCObject = local_90;
      this_00 = &(((String *)local_e8._40_8_)->super_GCObject).next_;
      (((String *)local_e8._40_8_)->super_GCObject).next_ = (GCObject *)0x0;
      *(undefined8 *)&(((String *)local_e8._40_8_)->super_GCObject).field_0x10 = 0;
      (((String *)local_e8._40_8_)->field_1).str_ = (char *)0x0;
      std::
      vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
      ::emplace_back<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>
                ((vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
                  *)this_00,
                 (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)&local_188)
      ;
      do {
        iVar8 = (in_RSI->look_ahead_).token_;
        if (iVar8 == 0x11e) {
          luna::Lexer::GetToken(in_RSI->lexer_,detail);
          iVar8 = (in_RSI->look_ahead_).token_;
        }
        if (iVar8 == 0x11e) {
          luna::Lexer::GetToken(in_RSI->lexer_,detail);
          iVar8 = (in_RSI->look_ahead_).token_;
        }
        else if (iVar8 == 0x3d) goto LAB_0014fb2b;
        if (iVar8 != 0x2c) {
          pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
          luna::ParseException::ParseException(pPVar14,"expect \',\' to split var",detail);
LAB_0014fe1e:
          __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
        }
        NextToken(in_RSI);
        ParsePrefixExp((ParserImpl *)&local_168,(PrefixExpType *)in_RSI);
        aVar6 = local_168;
        aVar10 = local_188;
        local_168.number_ = 0.0;
        local_188 = aVar6;
        if ((aVar10.str_ != (String *)0x0) &&
           ((*((aVar10.str_)->super_GCObject)._vptr_GCObject[1])(), local_168.str_ != (String *)0x0)
           ) {
          (*((local_168.str_)->super_GCObject)._vptr_GCObject[1])();
        }
        if (local_138._0_4_ != 1) {
          pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
          luna::ParseException::ParseException(pPVar14,"expect var here",t);
          goto LAB_0014fe1e;
        }
        std::
        vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
        ::emplace_back<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>
                  ((vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
                    *)this_00,
                   (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                   &local_188);
      } while( true );
    }
    local_190 = local_188;
    goto LAB_0014fb93;
  case 0x107:
    NextToken(in_RSI);
    if ((in_RSI->current_).token_ != 0x107) {
      __assert_fail("current_.token_ == Token_For",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                    ,0x1bb,
                    "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseForStatement()"
                   );
    }
    iVar7 = (in_RSI->look_ahead_).token_;
    if (iVar7 == 0x11e) {
      luna::Lexer::GetToken(in_RSI->lexer_,detail);
      iVar7 = (in_RSI->look_ahead_).token_;
    }
    if (iVar7 != 0x115) {
      pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
      luna::ParseException::ParseException(pPVar14,"expect \'id\' after \'for\'",detail);
      goto LAB_00150328;
    }
    pTVar11 = LookAhead2(in_RSI);
    if (pTVar11->token_ == 0x3d) {
      paVar12 = &NextToken(in_RSI)->field_0;
      local_188 = *paVar12;
      aStack_180 = paVar12[1];
      local_178 = paVar12[2];
      aStack_170 = paVar12[3];
      if ((in_RSI->current_).token_ != 0x115) {
        __assert_fail("current_.token_ == Token_Id",
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                      ,0x1c9,
                      "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseNumericForStatement()"
                     );
      }
      NextToken(in_RSI);
      if ((in_RSI->current_).token_ != 0x3d) {
        __assert_fail("current_.token_ == \'=\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                      ,0x1cc,
                      "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseNumericForStatement()"
                     );
      }
      local_108._16_8_ = (String *)0x0;
      local_168.number_ = 0.0;
      uStack_160 = 0;
      local_158 = 0;
      uStack_150 = 0x11e;
      op_01._28_4_ = uStack_14c;
      op_01.token_ = 0x11e;
      op_01.line_ = 0;
      op_01.column_ = 0;
      op_01.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
      op_01.module_ = (String *)0x0;
      ParseExp((ParserImpl *)&local_140,
               (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,op_01,
               (int)local_108 + 0x10);
      if ((String *)local_108._16_8_ != (String *)0x0) {
        (*((GCObject *)local_108._16_8_)->_vptr_GCObject[1])();
      }
      local_108._16_8_ = (String *)0x0;
      pTVar11 = NextToken(in_RSI);
      if (pTVar11->token_ != 0x2c) {
        pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException(pPVar14,"expect \',\' in numeric-for",t);
        __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
      }
      local_108._8_8_ = 0.0;
      local_138.number_ = 0.0;
      uStack_130 = 0;
      local_128 = 0;
      uStack_120 = 0x11e;
      op_02._28_4_ = uStack_11c;
      op_02.token_ = 0x11e;
      op_02.line_ = 0;
      op_02.column_ = 0;
      op_02.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
      op_02.module_ = (String *)0x0;
      ParseExp((ParserImpl *)(local_e8 + 0x30),
               (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,op_02,
               (int)local_108 + 8);
      if ((String *)local_108._8_8_ != (String *)0x0) {
        (*((GCObject *)local_108._8_8_)->_vptr_GCObject[1])();
      }
      local_108._8_8_ = 0.0;
      iVar7 = (in_RSI->look_ahead_).token_;
      if (iVar7 == 0x11e) {
        luna::Lexer::GetToken(in_RSI->lexer_,detail);
        iVar7 = (in_RSI->look_ahead_).token_;
      }
      if (iVar7 == 0x2c) {
        NextToken(in_RSI);
        local_110.number_ = 0.0;
        local_e8._0_8_ = (Lexer *)0x0;
        local_e8._8_8_ = 0.0;
        local_e8._16_8_ = (String *)0x0;
        local_e8._24_4_ = 0x11e;
        op_03._28_4_ = local_e8._28_4_;
        op_03.token_ = 0x11e;
        op_03.line_ = 0;
        op_03.column_ = 0;
        op_03.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
        op_03.module_ = (String *)0x0;
        ParseExp((ParserImpl *)local_108,
                 (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,
                 op_03,(int)&local_110);
        pLVar15 = (Lexer *)local_108._0_8_;
        if (local_110.str_ != (String *)0x0) {
          (*((local_110.str_)->super_GCObject)._vptr_GCObject[1])();
        }
        local_110.number_ = 0.0;
      }
      else {
        pLVar15 = (Lexer *)0x0;
      }
      pTVar11 = NextToken(in_RSI);
      if (pTVar11->token_ != 0x102) {
        pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException(pPVar14,"expect \'do\' to start numeric-for body",t);
        __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
      }
      ParseBlock((ParserImpl *)local_108);
      pTVar11 = NextToken(in_RSI);
      if (pTVar11->token_ != 0x105) {
        pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException(pPVar14,"expect \'end\' to complete numeric-for",t);
        __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
      }
      local_190.str_ = (String *)operator_new(0x48);
      ((local_190.str_)->super_GCObject)._vptr_GCObject = local_a8;
      ((local_190.str_)->super_GCObject).next_ = (GCObject *)local_188;
      *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)&((local_190.str_)->super_GCObject).field_0x10 =
           aStack_180;
      ((local_190.str_)->field_1).str_ = (char *)local_178;
      *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)((long)&(local_190.str_)->field_1 + 8) =
           aStack_170;
      *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)&(local_190.str_)->length_ = local_140;
      (local_190.str_)->hash_ = local_e8._48_8_;
      local_190.str_[1].super_GCObject._vptr_GCObject = (_func_int **)pLVar15;
      local_190.str_[1].super_GCObject.next_ = (GCObject *)local_108._0_8_;
    }
    else {
      if ((in_RSI->look_ahead_).token_ == 0x11e) {
        luna::Lexer::GetToken(in_RSI->lexer_,detail);
      }
      iVar7 = (in_RSI->look_ahead_).line_;
      ParseNameList((ParserImpl *)&local_188);
      pTVar11 = NextToken(in_RSI);
      if (pTVar11->token_ != 0x10a) {
        pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException(pPVar14,"expect \'in\' in generic-for",t);
        __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
      }
      ParseExpList((ParserImpl *)&local_168);
      pTVar11 = NextToken(in_RSI);
      if (pTVar11->token_ != 0x102) {
        pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException(pPVar14,"expect \'do\' to start generic-for body",t);
        __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
      }
      ParseBlock((ParserImpl *)&local_138);
      pTVar11 = NextToken(in_RSI);
      if (pTVar11->token_ != 0x105) {
        pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException(pPVar14,"expect \'end\' to complete generic-for",t);
        __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
      }
      local_190.str_ = (String *)operator_new(0x28);
      ((local_190.str_)->super_GCObject)._vptr_GCObject = (_func_int **)local_a0;
      ((local_190.str_)->super_GCObject).next_ = (GCObject *)local_188;
      *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)&((local_190.str_)->super_GCObject).field_0x10 =
           local_168;
      ((local_190.str_)->field_1).str_ = (char *)local_138;
      *(int *)((long)&(local_190.str_)->field_1 + 8) = iVar7;
    }
    break;
  case 0x108:
    NextToken(in_RSI);
    if ((in_RSI->current_).token_ != 0x108) {
      __assert_fail("current_.token_ == Token_Function",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                    ,0x195,
                    "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseFunctionStatement()"
                   );
    }
    pTVar11 = NextToken(in_RSI);
    if (pTVar11->token_ != 0x115) {
      pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
      luna::ParseException::ParseException(pPVar14,"unexpect token after \'function\'",t);
      goto LAB_00150328;
    }
    pGVar13 = (GCObject *)operator_new(0x48);
    pGVar13->_vptr_GCObject = local_58;
    pGVar13->next_ = (GCObject *)0x0;
    *(undefined8 *)&pGVar13->field_0x10 = 0;
    pGVar13[1]._vptr_GCObject = (_func_int **)0x0;
    pGVar13[1].next_ = (GCObject *)0x0;
    *(undefined8 *)&pGVar13[1].field_0x10 = 0;
    pGVar13[2]._vptr_GCObject = (_func_int **)0x0;
    *(undefined4 *)&pGVar13[2].next_ = 0x11e;
    *(undefined4 *)&pGVar13[2].field_0x10 = 0;
    std::vector<luna::TokenDetail,std::allocator<luna::TokenDetail>>::
    _M_realloc_insert<luna::TokenDetail_const&>
              ((vector<luna::TokenDetail,std::allocator<luna::TokenDetail>> *)&pGVar13->next_,
               (iterator)0x0,t);
    while( true ) {
      iVar7 = (in_RSI->look_ahead_).token_;
      if (iVar7 == 0x11e) {
        luna::Lexer::GetToken(in_RSI->lexer_,detail);
        iVar7 = (in_RSI->look_ahead_).token_;
      }
      if (iVar7 != 0x2e) break;
      NextToken(in_RSI);
      pTVar11 = NextToken(in_RSI);
      if (pTVar11->token_ != 0x115) {
        pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException
                  (pPVar14,"unexpect token in function name after \'.\'",t);
        goto LAB_0014fe88;
      }
      __position._M_current = *(TokenDetail **)&pGVar13->field_0x10;
      if (__position._M_current == (TokenDetail *)pGVar13[1]._vptr_GCObject) {
        std::vector<luna::TokenDetail,std::allocator<luna::TokenDetail>>::
        _M_realloc_insert<luna::TokenDetail_const&>
                  ((vector<luna::TokenDetail,std::allocator<luna::TokenDetail>> *)&pGVar13->next_,
                   __position,t);
      }
      else {
        aVar10 = t->field_0;
        pSVar2 = (in_RSI->current_).module_;
        iVar7 = (in_RSI->current_).column_;
        iVar8 = (in_RSI->current_).token_;
        uVar5 = *(undefined4 *)&(in_RSI->current_).field_0x1c;
        (__position._M_current)->line_ = (in_RSI->current_).line_;
        (__position._M_current)->column_ = iVar7;
        (__position._M_current)->token_ = iVar8;
        *(undefined4 *)&(__position._M_current)->field_0x1c = uVar5;
        (__position._M_current)->field_0 = aVar10;
        (__position._M_current)->module_ = pSVar2;
        *(long *)&pGVar13->field_0x10 = *(long *)&pGVar13->field_0x10 + 0x20;
      }
    }
    if (iVar7 == 0x11e) {
      luna::Lexer::GetToken(in_RSI->lexer_,detail);
      iVar7 = (in_RSI->look_ahead_).token_;
    }
    if (iVar7 == 0x3a) {
      NextToken(in_RSI);
      pTVar11 = NextToken(in_RSI);
      if (pTVar11->token_ != 0x115) {
        pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException
                  (pPVar14,"unexpect token in function name after \':\'",t);
LAB_0014fe88:
        __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
      }
      aVar10 = t->field_0;
      pSVar2 = (in_RSI->current_).module_;
      uVar4 = *(undefined8 *)&(in_RSI->current_).column_;
      *(undefined8 *)&pGVar13[1].field_0x14 = *(undefined8 *)((long)&(in_RSI->current_).module_ + 4)
      ;
      *(undefined8 *)((long)&pGVar13[2]._vptr_GCObject + 4) = uVar4;
      pGVar13[1].next_ = (GCObject *)aVar10;
      *(String **)&pGVar13[1].field_0x10 = pSVar2;
    }
    ParseFunctionBody((ParserImpl *)&local_188);
    local_190.str_ = (String *)operator_new(0x18);
    ((local_190.str_)->super_GCObject)._vptr_GCObject = local_80;
    ((local_190.str_)->super_GCObject).next_ = pGVar13;
    *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)&((local_190.str_)->super_GCObject).field_0x10 =
         local_188;
    break;
  case 0x109:
    NextToken(in_RSI);
    if ((in_RSI->current_).token_ != 0x109) {
      __assert_fail("current_.token_ == Token_If",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                    ,0x151,
                    "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseIfStatement()"
                   );
    }
    iVar7 = (in_RSI->current_).line_;
    local_138.number_ = 0.0;
    local_188.number_ = 0.0;
    aStack_180.number_ = 0.0;
    local_178.number_ = 0.0;
    aStack_170._0_4_ = 0x11e;
    op_04.line_ = 0;
    op_04.column_ = 0;
    op_04.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
    op_04.module_ = (String *)0x0;
    op_04._24_8_ = aStack_170.str_;
    ParseExp((ParserImpl *)&local_168,
             (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,op_04,
             (int)&local_138);
    if (local_138.str_ != (String *)0x0) {
      (*((local_138.str_)->super_GCObject)._vptr_GCObject[1])();
    }
    pTVar11 = NextToken(in_RSI);
    if (pTVar11->token_ != 0x111) {
      pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
      luna::ParseException::ParseException(pPVar14,"expect \'then\' for if",t);
      __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
    }
    ParseBlock((ParserImpl *)local_e8);
    if ((in_RSI->look_ahead_).token_ == 0x11e) {
      luna::Lexer::GetToken(in_RSI->lexer_,detail);
    }
    iVar8 = (in_RSI->look_ahead_).line_;
    ParseFalseBranchStatement((ParserImpl *)&local_140);
    local_190.str_ = (String *)operator_new(0x28);
    ((local_190.str_)->super_GCObject)._vptr_GCObject = local_70;
    ((local_190.str_)->super_GCObject).next_ = (GCObject *)local_168;
    *(undefined8 *)&((local_190.str_)->super_GCObject).field_0x10 = local_e8._0_8_;
    ((local_190.str_)->field_1).str_ = (char *)local_140;
    *(int *)((long)&(local_190.str_)->field_1 + 8) = iVar7;
    *(int *)((long)&(local_190.str_)->field_1 + 0xc) = iVar8;
    break;
  case 0x10b:
    NextToken(in_RSI);
    if ((in_RSI->current_).token_ != 0x10b) {
      __assert_fail("current_.token_ == Token_Local",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                    ,0x200,
                    "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseLocalStatement()"
                   );
    }
    iVar7 = (in_RSI->look_ahead_).token_;
    if (iVar7 == 0x11e) {
      luna::Lexer::GetToken(in_RSI->lexer_,detail);
      iVar7 = (in_RSI->look_ahead_).token_;
    }
    if (iVar7 == 0x11e) {
      luna::Lexer::GetToken(in_RSI->lexer_,detail);
      iVar7 = (in_RSI->look_ahead_).token_;
    }
    else if (iVar7 == 0x108) {
      NextToken(in_RSI);
      if ((in_RSI->current_).token_ != 0x108) {
        __assert_fail("current_.token_ == Token_Function",
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                      ,0x210,
                      "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseLocalFunction()"
                     );
      }
      pTVar11 = NextToken(in_RSI);
      if (pTVar11->token_ != 0x115) {
        pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException(pPVar14,"expect \'id\' after \'local function\'",t);
        goto LAB_00150328;
      }
      local_188 = t->field_0;
      aStack_180 = (anon_union_8_2_010d16d7_for_TokenDetail_0)(in_RSI->current_).module_;
      local_178 = *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)&(in_RSI->current_).line_;
      aStack_170 = *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)&(in_RSI->current_).token_;
      ParseFunctionBody((ParserImpl *)&local_168);
      local_190.str_ = (String *)operator_new(0x30);
      ((local_190.str_)->super_GCObject)._vptr_GCObject = local_b0;
      ((local_190.str_)->super_GCObject).next_ = (GCObject *)local_188;
      *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)&((local_190.str_)->super_GCObject).field_0x10 =
           aStack_180;
      ((local_190.str_)->field_1).str_ = (char *)local_178;
      *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)((long)&(local_190.str_)->field_1 + 8) =
           aStack_170;
      *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)&(local_190.str_)->length_ = local_168;
      break;
    }
    if (iVar7 != 0x115) {
      pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
      luna::ParseException::ParseException(pPVar14,"unexpect token after \'local\'",detail);
LAB_00150328:
      __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
    }
    iVar7 = (in_RSI->look_ahead_).line_;
    ParseNameList((ParserImpl *)&local_188);
    iVar8 = (in_RSI->look_ahead_).token_;
    if (iVar8 == 0x11e) {
      luna::Lexer::GetToken(in_RSI->lexer_,detail);
      iVar8 = (in_RSI->look_ahead_).token_;
    }
    if (iVar8 == 0x3d) {
      NextToken(in_RSI);
      ParseExpList((ParserImpl *)&local_168);
      aVar10 = local_168;
    }
    else {
      aVar10.number_ = 0.0;
    }
    local_190.str_ = (String *)operator_new(0x28);
    ((local_190.str_)->super_GCObject)._vptr_GCObject = local_88;
    ((local_190.str_)->super_GCObject).next_ = (GCObject *)local_188;
    *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)&((local_190.str_)->super_GCObject).field_0x10 =
         aVar10;
    *(int *)&(local_190.str_)->field_1 = iVar7;
    *(undefined8 *)((long)&(local_190.str_)->field_1 + 8) = 0;
    break;
  case 0x10f:
    NextToken(in_RSI);
    if ((in_RSI->current_).token_ != 0x10f) {
      __assert_fail("current_.token_ == Token_Repeat",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                    ,0x13f,
                    "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseRepeatStatement()"
                   );
    }
    ParseBlock((ParserImpl *)&local_168);
    pTVar11 = NextToken(in_RSI);
    if (pTVar11->token_ != 0x113) {
      pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
      luna::ParseException::ParseException(pPVar14,"expect \'until\' for repeat-statement",t);
      __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
    }
    iVar7 = (in_RSI->current_).line_;
    local_e8._0_8_ = (Lexer *)0x0;
    local_188.number_ = 0.0;
    aStack_180.number_ = 0.0;
    local_178.number_ = 0.0;
    aStack_170._0_4_ = 0x11e;
    op_00.line_ = 0;
    op_00.column_ = 0;
    op_00.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
    op_00.module_ = (String *)0x0;
    op_00._24_8_ = aStack_170.str_;
    ParseExp((ParserImpl *)&local_138,
             (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,op_00,
             (int)local_e8);
    if ((Lexer *)local_e8._0_8_ != (Lexer *)0x0) {
      (*(code *)((*(State **)local_e8._0_8_)->string_pool_)._M_t.
                super___uniq_ptr_impl<luna::StringPool,_std::default_delete<luna::StringPool>_>._M_t
                .super__Tuple_impl<0UL,_luna::StringPool_*,_std::default_delete<luna::StringPool>_>.
                super__Head_base<0UL,_luna::StringPool_*,_false>._M_head_impl)();
    }
    local_190.str_ = (String *)operator_new(0x20);
    ((local_190.str_)->super_GCObject)._vptr_GCObject = local_68;
    ((local_190.str_)->super_GCObject).next_ = (GCObject *)local_168;
    *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)&((local_190.str_)->super_GCObject).field_0x10 =
         local_138;
    *(int *)&(local_190.str_)->field_1 = iVar7;
    break;
  case 0x114:
    NextToken(in_RSI);
    if ((in_RSI->current_).token_ != 0x114) {
      __assert_fail("current_.token_ == Token_While",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                    ,0x128,
                    "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseWhileStatement()"
                   );
    }
    iVar7 = (in_RSI->current_).line_;
    local_138.number_ = 0.0;
    local_188.number_ = 0.0;
    aStack_180.number_ = 0.0;
    local_178.number_ = 0.0;
    aStack_170._0_4_ = 0x11e;
    op.line_ = 0;
    op.column_ = 0;
    op.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
    op.module_ = (String *)0x0;
    op._24_8_ = aStack_170.str_;
    ParseExp((ParserImpl *)&local_168,
             (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,op,
             (int)&local_138);
    if (local_138.str_ != (String *)0x0) {
      (*((local_138.str_)->super_GCObject)._vptr_GCObject[1])();
    }
    pTVar11 = NextToken(in_RSI);
    if (pTVar11->token_ != 0x102) {
      pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
      luna::ParseException::ParseException(pPVar14,"expect \'do\' for while-statement",t);
      __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
    }
    ParseBlock((ParserImpl *)local_e8);
    pTVar11 = NextToken(in_RSI);
    if (pTVar11->token_ != 0x105) {
      pPVar14 = (ParseException *)__cxa_allocate_exception(0x20);
      luna::ParseException::ParseException(pPVar14,"expect \'end\' for while-statement",t);
      __cxa_throw(pPVar14,&luna::ParseException::typeinfo,luna::Exception::~Exception);
    }
    iVar8 = (in_RSI->current_).line_;
    local_190.str_ = (String *)operator_new(0x20);
    ((local_190.str_)->super_GCObject)._vptr_GCObject = local_78;
    ((local_190.str_)->super_GCObject).next_ = (GCObject *)local_168;
    *(undefined8 *)&((local_190.str_)->super_GCObject).field_0x10 = local_e8._0_8_;
    *(int *)&(local_190.str_)->field_1 = iVar7;
    *(int *)((long)&(local_190.str_)->field_1 + 4) = iVar8;
    break;
  default:
    if (iVar7 != 0x3b) goto switchD_0014f216_caseD_103;
    NextToken(in_RSI);
    goto LAB_0014f0ba;
  }
LAB_0014fd8e:
  std::
  vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
  ::emplace_back<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>
            (local_40,(unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_190);
  aVar10 = local_190;
LAB_0014fda5:
  if (aVar10.str_ != (String *)0x0) {
    (*((aVar10.str_)->super_GCObject)._vptr_GCObject[1])();
  }
  goto LAB_0014f0ba;
LAB_0014fb2b:
  NextToken(in_RSI);
  ParseExpList((ParserImpl *)&local_168);
  local_190.str_ = (String *)operator_new(0x28);
  ((local_190.str_)->super_GCObject)._vptr_GCObject = (_func_int **)local_98;
  ((local_190.str_)->super_GCObject).next_ = (GCObject *)local_e8._40_8_;
  *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)&((local_190.str_)->super_GCObject).field_0x10 =
       local_168;
  *(int *)&(local_190.str_)->field_1 = iVar7;
  *(undefined8 *)((long)&(local_190.str_)->field_1 + 8) = 0;
  if (local_188.str_ != (String *)0x0) {
    (*((local_188.str_)->super_GCObject)._vptr_GCObject[1])();
LAB_0014fb93:
    if (local_190.str_ == (String *)0x0) goto LAB_0014f0ba;
  }
  goto LAB_0014fd8e;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseBlock()
        {
            std::unique_ptr<Block> block(new Block);

            bool has_return = false;
            while (LookAhead().token_ != Token_EOF &&
                   LookAhead().token_ != Token_End &&
                   LookAhead().token_ != Token_Until &&
                   LookAhead().token_ != Token_Elseif &&
                   LookAhead().token_ != Token_Else)
            {
                if (has_return)
                    throw ParseException("unexpect statement after return statement", look_ahead_);

                if (LookAhead().token_ == Token_Return)
                {
                    block->return_stmt_ = ParseReturnStatement();
                    has_return = true;
                }
                else
                {
                    std::unique_ptr<SyntaxTree> statement = ParseStatement();
                    if (statement)
                        block->statements_.push_back(std::move(statement));
                }
            }

            return std::move(block);
        }